

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlinsolx1.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *fp_00;
  int local_d04;
  int i;
  double *sol;
  char msg_9 [256];
  char msg_8 [256];
  char msg_7 [256];
  char msg_6 [256];
  char msg_5 [256];
  char msg_4 [256];
  char msg_3 [256];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  FILE *fp;
  SuperLUStat_t stat;
  superlu_options_t options;
  mem_usage_t mem_usage;
  double rcond;
  double rpg;
  double u;
  double *berr;
  double *ferr;
  double *C;
  double *R;
  double *xact;
  double *rhsx;
  double *rhsb;
  int_t local_1d8;
  int_t nnz;
  int_t lwork;
  int_t info;
  int ldx;
  int nrhs;
  int n;
  int m;
  void *work;
  int *etree;
  int *perm_r;
  int *perm_c;
  int_t *xa;
  int_t *asub;
  double *a;
  GlobalLU_t Glu;
  SCformat *Lstore;
  NCformat *Ustore;
  NCformat *Astore;
  SuperMatrix X;
  SuperMatrix B;
  SuperMatrix U;
  SuperMatrix L;
  SuperMatrix A;
  yes_no_t local_48;
  trans_t trans;
  yes_no_t equil;
  char equed [1];
  char **argv_local;
  int argc_local;
  
  fp_00 = _stdin;
  _n = (void *)0x0;
  local_1d8 = 0;
  info = 1;
  local_48 = YES;
  rpg = 1.0;
  A.Store._4_4_ = NO;
  _equil = argv;
  set_default_options((superlu_options_t *)&stat.expansions);
  parse_command_line(argc,_equil,&local_1d8,&rpg,&local_48,(trans_t *)((long)&A.Store + 4));
  stat._36_4_ = local_48;
  options._16_8_ = rpg;
  options.Equil = A.Store._4_4_;
  if ((0 < local_1d8) && (_n = superlu_malloc((long)local_1d8), _n == (void *)0x0)) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","DLINSOLX: cannot allocate work[]",0x6b,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  dreadhb(fp_00,&nrhs,&ldx,(int_t *)((long)&rhsb + 4),(double **)&asub,&xa,&perm_c);
  dCreate_CompCol_Matrix
            ((SuperMatrix *)&L.Store,nrhs,ldx,rhsb._4_4_,(double *)asub,xa,perm_c,SLU_NC,SLU_D,
             SLU_GE);
  printf("Dimension %dx%d; # nonzeros %d\n",(ulong)A.Dtype,(ulong)A.Mtype,(ulong)*(uint *)A._16_8_);
  rhsx = doubleMalloc((long)(nrhs * info));
  if (rhsx == (double *)0x0) {
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","Malloc fails for rhsb[].",0x76,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  xact = doubleMalloc((long)(nrhs * info));
  if (xact == (double *)0x0) {
    sprintf(msg_3 + 0xf8,"%s at line %d in file %s\n","Malloc fails for rhsx[].",0x77,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit(msg_3 + 0xf8);
  }
  dCreate_Dense_Matrix((SuperMatrix *)&X.Store,nrhs,info,rhsx,nrhs,SLU_DN,SLU_D,SLU_GE);
  dCreate_Dense_Matrix((SuperMatrix *)&Astore,nrhs,info,xact,nrhs,SLU_DN,SLU_D,SLU_GE);
  R = doubleMalloc((long)(ldx * info));
  lwork = ldx;
  dGenXtrue(ldx,info,R,ldx);
  dFillRHS(A.Store._4_4_,info,R,lwork,(SuperMatrix *)&L.Store,(SuperMatrix *)&X.Store);
  work = int32Malloc(ldx);
  if ((int *)work == (int *)0x0) {
    sprintf(msg_4 + 0xf8,"%s at line %d in file %s\n","Malloc fails for etree[].",0x7f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit(msg_4 + 0xf8);
  }
  etree = int32Malloc(nrhs);
  if (etree == (int *)0x0) {
    sprintf(msg_5 + 0xf8,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0x80,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit(msg_5 + 0xf8);
  }
  perm_r = int32Malloc(ldx);
  if (perm_r == (int *)0x0) {
    sprintf(msg_6 + 0xf8,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0x81,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit(msg_6 + 0xf8);
  }
  C = (double *)superlu_malloc((long)(int)A.Dtype << 3);
  if (C == (double *)0x0) {
    sprintf(msg_7 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for R[].",0x83,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit(msg_7 + 0xf8);
  }
  ferr = (double *)superlu_malloc((long)(int)A.Mtype << 3);
  if (ferr == (double *)0x0) {
    sprintf(msg_8 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for C[].",0x85,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit(msg_8 + 0xf8);
  }
  berr = (double *)superlu_malloc((long)info << 3);
  if (berr == (double *)0x0) {
    sprintf(msg_9 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ferr[].",0x87,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit(msg_9 + 0xf8);
  }
  u = (double)superlu_malloc((long)info << 3);
  if ((void *)u == (void *)0x0) {
    sprintf((char *)&sol,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for berr[].",0x89,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&sol);
  }
  StatInit((SuperLUStat_t *)&fp);
  B.Mtype = SLU_GE;
  dgssvx((superlu_options_t *)&stat.expansions,(SuperMatrix *)&L.Store,perm_r,etree,(int *)work,
         (char *)((long)&trans + 3),C,ferr,(SuperMatrix *)&U.Store,(SuperMatrix *)&B.Store,_n,
         local_1d8,(SuperMatrix *)&X.Store,(SuperMatrix *)&Astore,&rcond,(double *)&mem_usage,berr,
         (double *)u,(GlobalLU_t *)&a,(mem_usage_t *)&options.lookahead_etree,(SuperLUStat_t *)&fp,
         &nnz);
  printf("LU factorization: dgssvx() returns info %lld\n",(long)nnz);
  if ((nnz == 0) || (nnz == ldx + 1)) {
    if (options.DiagPivotThresh._4_4_ != 0) {
      printf("Recip. pivot growth = %e\n",rcond);
    }
    if (options.SymmetricMode != NO) {
      printf("Recip. condition number = %e\n",mem_usage);
    }
    Glu.stack.array = (void *)L._16_8_;
    printf("No of nonzeros in factor L = %lld\n",(long)*(int *)L._16_8_);
    printf("No of nonzeros in factor U = %lld\n",(long)*(int *)U._16_8_);
    printf("No of nonzeros in L+U = %lld\n",
           ((long)*Glu.stack.array + (long)*(int *)U._16_8_) - (long)ldx);
    printf("FILL ratio = %.1f\n",
           (double)((float)((*Glu.stack.array + *(int *)U._16_8_) - ldx) / (float)rhsb._4_4_));
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)(float)options.lookahead_etree / 1000000.0
           ,(double)(float)options.SymPattern / 1000000.0);
    fflush(_stdout);
  }
  else if ((0 < nnz) && (local_1d8 == -1)) {
    printf("** Estimated memory: %lld bytes\n",(long)nnz - (long)ldx);
  }
  if (options.SolveInitialized != NO) {
    StatPrint((SuperLUStat_t *)&fp);
  }
  StatFree((SuperLUStat_t *)&fp);
  stat.expansions = 3;
  B.Mtype = info;
  StatInit((SuperLUStat_t *)&fp);
  dgssvx((superlu_options_t *)&stat.expansions,(SuperMatrix *)&L.Store,perm_r,etree,(int *)work,
         (char *)((long)&trans + 3),C,ferr,(SuperMatrix *)&U.Store,(SuperMatrix *)&B.Store,_n,
         local_1d8,(SuperMatrix *)&X.Store,(SuperMatrix *)&Astore,&rcond,(double *)&mem_usage,berr,
         (double *)u,(GlobalLU_t *)&a,(mem_usage_t *)&options.lookahead_etree,(SuperLUStat_t *)&fp,
         &nnz);
  printf("Triangular solve: dgssvx() returns info %lld\n",(long)nnz);
  if ((nnz == 0) || (nnz == ldx + 1)) {
    if (options.ColPerm != NATURAL) {
      printf("Iterative Refinement:\n");
      printf("%8s%8s%16s%16s\n","rhs","Steps","FERR","BERR");
      for (local_d04 = 0; local_d04 < info; local_d04 = local_d04 + 1) {
        printf("%8d%8d%16e%16e\n",berr[local_d04],*(undefined8 *)((long)u + (long)local_d04 * 8),
               (ulong)(local_d04 + 1),(ulong)stat.ops._4_4_);
      }
    }
    fflush(_stdout);
  }
  else if ((0 < nnz) && (local_1d8 == -1)) {
    printf("** Estimated memory: %lld bytes\n",(long)nnz - (long)ldx);
  }
  if (options.SolveInitialized != NO) {
    StatPrint((SuperLUStat_t *)&fp);
  }
  StatFree((SuperLUStat_t *)&fp);
  superlu_free(rhsx);
  superlu_free(xact);
  superlu_free(R);
  superlu_free(work);
  superlu_free(etree);
  superlu_free(perm_r);
  superlu_free(C);
  superlu_free(ferr);
  superlu_free(berr);
  superlu_free((void *)u);
  Destroy_CompCol_Matrix((SuperMatrix *)&L.Store);
  Destroy_SuperMatrix_Store((SuperMatrix *)&X.Store);
  Destroy_SuperMatrix_Store((SuperMatrix *)&Astore);
  if (local_1d8 == 0) {
    Destroy_SuperNode_Matrix((SuperMatrix *)&U.Store);
    Destroy_CompCol_Matrix((SuperMatrix *)&B.Store);
  }
  else if (0 < local_1d8) {
    superlu_free(_n);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
/*!
 * \brief The driver program DLINSOLX1.
 *
 * This example illustrates how to use DGSSVX to solve systems with the same
 * A but different right-hand side.
 * In this case, we factorize A only once in the first call to DGSSVX,
 * and reuse the following data structures in the subsequent call to DGSSVX:
 *     perm_c, perm_r, R, C, L, U.
 * 
 */
    char           equed[1];
    yes_no_t       equil;
    trans_t        trans;
    SuperMatrix    A, L, U;
    SuperMatrix    B, X;
    NCformat       *Astore;
    NCformat       *Ustore;
    SCformat       *Lstore;
    GlobalLU_t	   Glu; /* facilitate multiple factorizations with 
                           SamePattern_SameRowPerm                  */
    double         *a;
    int_t          *asub, *xa;
    int            *perm_c; /* column permutation vector */
    int            *perm_r; /* row permutations from partial pivoting */
    int            *etree;
    void           *work = NULL;
    int            m, n, nrhs, ldx;
    int_t          info, lwork, nnz;
    double         *rhsb, *rhsx, *xact;
    double         *R, *C;
    double         *ferr, *berr;
    double         u, rpg, rcond;
    mem_usage_t    mem_usage;
    superlu_options_t options;
    SuperLUStat_t stat;
    FILE           *fp = stdin;

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter main()");
#endif

    /* Defaults */
    lwork = 0;
    nrhs  = 1;
    equil = YES;	
    u     = 1.0;
    trans = NOTRANS;

    /* Set the default values for options argument:
	options.Fact = DOFACT;
        options.Equil = YES;
    	options.ColPerm = COLAMD;
	options.DiagPivotThresh = 1.0;
    	options.Trans = NOTRANS;
    	options.IterRefine = NOREFINE;
    	options.SymmetricMode = NO;
    	options.PivotGrowth = NO;
    	options.ConditionNumber = NO;
    	options.PrintStat = YES;
    */
    set_default_options(&options);

    /* Can use command line input to modify the defaults. */
    parse_command_line(argc, argv, &lwork, &u, &equil, &trans);
    options.Equil = equil;
    options.DiagPivotThresh = u;
    options.Trans = trans;
    
    if ( lwork > 0 ) {
	work = SUPERLU_MALLOC(lwork);
	if ( !work ) {
	    ABORT("DLINSOLX: cannot allocate work[]");
	}
    }

    /* Read matrix A from a file in Harwell-Boeing format.*/
    dreadhb(fp, &m, &n, &nnz, &a, &asub, &xa);
    
    dCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_D, SLU_GE);
    Astore = A.Store;
    printf("Dimension %dx%d; # nonzeros %d\n", (int)A.nrow, (int)A.ncol, (int)Astore->nnz);
    
    if ( !(rhsb = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsb[].");
    if ( !(rhsx = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsx[].");
    dCreate_Dense_Matrix(&B, m, nrhs, rhsb, m, SLU_DN, SLU_D, SLU_GE);
    dCreate_Dense_Matrix(&X, m, nrhs, rhsx, m, SLU_DN, SLU_D, SLU_GE);
    xact = doubleMalloc(n * nrhs);
    ldx = n;
    dGenXtrue(n, nrhs, xact, ldx);
    dFillRHS(trans, nrhs, xact, ldx, &A, &B);
    
    if ( !(etree = int32Malloc(n)) ) ABORT("Malloc fails for etree[].");
    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");
    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");
    if ( !(R = (double *) SUPERLU_MALLOC(A.nrow * sizeof(double))) ) 
        ABORT("SUPERLU_MALLOC fails for R[].");
    if ( !(C = (double *) SUPERLU_MALLOC(A.ncol * sizeof(double))) )
        ABORT("SUPERLU_MALLOC fails for C[].");
    if ( !(ferr = (double *) SUPERLU_MALLOC(nrhs * sizeof(double))) )
        ABORT("SUPERLU_MALLOC fails for ferr[].");
    if ( !(berr = (double *) SUPERLU_MALLOC(nrhs * sizeof(double))) ) 
        ABORT("SUPERLU_MALLOC fails for berr[].");

    /* Initialize the statistics variables. */
    StatInit(&stat);
    
    /* ONLY PERFORM THE LU DECOMPOSITION */
    B.ncol = 0;  /* Indicate not to solve the system */
    dgssvx(&options, &A, perm_c, perm_r, etree, equed, R, C,
           &L, &U, work, lwork, &B, &X, &rpg, &rcond, ferr, berr,
           &Glu, &mem_usage, &stat, &info);

    printf("LU factorization: dgssvx() returns info %lld\n", (long long)info);

    if ( info == 0 || info == n+1 ) {

	if ( options.PivotGrowth ) printf("Recip. pivot growth = %e\n", rpg);
	if ( options.ConditionNumber )
	    printf("Recip. condition number = %e\n", rcond);
        Lstore = (SCformat *) L.Store;
        Ustore = (NCformat *) U.Store;
	printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    	printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    	printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
    	printf("FILL ratio = %.1f\n", (float)(Lstore->nnz + Ustore->nnz - n)/nnz);

	printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	       mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	fflush(stdout);

    } else if ( info > 0 && lwork == -1 ) {
        printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    /* ------------------------------------------------------------
       NOW WE SOLVE THE LINEAR SYSTEM USING THE FACTORED FORM OF A.
       ------------------------------------------------------------*/
    options.Fact = FACTORED; /* Indicate the factored form of A is supplied. */
    B.ncol = nrhs;  /* Set the number of right-hand side */

    /* Initialize the statistics variables. */
    StatInit(&stat);

    dgssvx(&options, &A, perm_c, perm_r, etree, equed, R, C,
           &L, &U, work, lwork, &B, &X, &rpg, &rcond, ferr, berr,
           &Glu, &mem_usage, &stat, &info);

    printf("Triangular solve: dgssvx() returns info %lld\n", (long long)info);

    if ( info == 0 || info == n+1 ) {

        /* This is how you could access the solution matrix. */
        double *sol = (double*) ((DNformat*) X.Store)->nzval; 
        (void)sol;  // suppress unused variable warning

	if ( options.IterRefine ) {
            printf("Iterative Refinement:\n");
	    printf("%8s%8s%16s%16s\n", "rhs", "Steps", "FERR", "BERR");
	    for (int i = 0; i < nrhs; ++i)
	      printf("%8d%8d%16e%16e\n", i+1, stat.RefineSteps, ferr[i], berr[i]);
	}
	fflush(stdout);
    } else if ( info > 0 && lwork == -1 ) {
        printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    SUPERLU_FREE (rhsb);
    SUPERLU_FREE (rhsx);
    SUPERLU_FREE (xact);
    SUPERLU_FREE (etree);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    SUPERLU_FREE (R);
    SUPERLU_FREE (C);
    SUPERLU_FREE (ferr);
    SUPERLU_FREE (berr);
    Destroy_CompCol_Matrix(&A);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperMatrix_Store(&X);
    if ( lwork == 0 ) {
        Destroy_SuperNode_Matrix(&L);
        Destroy_CompCol_Matrix(&U);
    } else if ( lwork > 0 ) {
        SUPERLU_FREE(work);
    }


#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit main()");
#endif
    return EXIT_SUCCESS;
}